

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void amrex::Copy<amrex::EBCellFlagFab,void>
               (FabArray<amrex::EBCellFlagFab> *dst,FabArray<amrex::EBCellFlagFab> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  MFIter *in_RDI;
  int in_R8D;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<amrex::EBCellFlag> dstFab;
  Array4<const_amrex::EBCellFlag> srcFab;
  Box *bx;
  MFIter mfi;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int iVar3;
  int local_250;
  int local_24c;
  undefined1 in_stack_fffffffffffffdc7;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  IntVect *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  Box local_184;
  Box *local_168;
  MFIter local_160;
  int local_f4;
  int local_f0;
  int local_ec;
  IntVect *local_d8;
  int local_d0;
  Box *local_c8;
  int local_bc;
  int iStack_b8;
  int local_b4;
  undefined8 local_b0;
  int local_a8;
  Box *local_a0;
  int local_98;
  int iStack_94;
  int local_90;
  undefined4 local_8c;
  IntVect *local_88;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  Box *local_48;
  undefined4 local_3c;
  Box *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  local_f4 = in_R8D;
  local_f0 = in_ECX;
  local_ec = in_EDX;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (bool)in_stack_fffffffffffffdc7);
  while (bVar2 = MFIter::isValid(&local_160), bVar2) {
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    local_168 = &local_184;
    bVar2 = Box::ok(local_168);
    if (bVar2) {
      FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),in_RDI);
      FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),in_RDI);
      local_c8 = local_168;
      local_38 = local_168;
      local_3c = 0;
      local_bc = (local_168->smallend).vect[0];
      local_48 = local_168;
      local_4c = 1;
      iStack_b8 = (local_168->smallend).vect[1];
      in_stack_fffffffffffffdd8 = *(IntVect **)(local_168->smallend).vect;
      local_58 = local_168;
      local_5c = 2;
      in_stack_fffffffffffffde0 = (local_168->smallend).vect[2];
      local_a0 = local_168;
      local_68 = &local_168->bigend;
      local_6c = 0;
      local_98 = local_68->vect[0];
      local_78 = &local_168->bigend;
      local_7c = 1;
      iStack_94 = (local_168->bigend).vect[1];
      local_b0 = *(undefined8 *)local_68->vect;
      local_88 = &local_168->bigend;
      local_8c = 2;
      local_a8 = (local_168->bigend).vect[2];
      for (local_24c = 0; local_250 = in_stack_fffffffffffffde0,
          local_d8 = in_stack_fffffffffffffdd8, local_d0 = in_stack_fffffffffffffde0,
          local_b4 = in_stack_fffffffffffffde0, local_90 = local_a8, local_24c < local_f4;
          local_24c = local_24c + 1) {
        for (; iVar3 = iStack_b8, local_250 <= local_a8; local_250 = local_250 + 1) {
          for (; iVar1 = local_bc, iVar3 <= iStack_94; iVar3 = iVar3 + 1) {
            while (in_stack_fffffffffffffda8 = iVar1, in_stack_fffffffffffffda8 <= local_98) {
              local_2c = local_250;
              local_30 = local_ec + local_24c;
              local_20 = &local_1c8;
              local_14 = local_250;
              local_18 = local_f0 + local_24c;
              local_8 = &local_208;
              *(undefined4 *)
               (local_208 +
               ((long)(in_stack_fffffffffffffda8 - local_1e8) + (iVar3 - local_1e4) * local_200 +
                (local_250 - local_1e0) * local_1f8 + local_18 * local_1f0) * 4) =
                   *(undefined4 *)
                    (local_1c8 +
                    ((long)(in_stack_fffffffffffffda8 - local_1a8) + (iVar3 - local_1a4) * local_1c0
                     + (local_250 - local_1a0) * local_1b8 + local_30 * local_1b0) * 4);
              local_28 = iVar3;
              local_24 = in_stack_fffffffffffffda8;
              local_10 = iVar3;
              local_c = in_stack_fffffffffffffda8;
              iVar1 = in_stack_fffffffffffffda8 + 1;
            }
          }
          in_stack_fffffffffffffdac = iVar3;
        }
      }
    }
    MFIter::operator++(&local_160);
  }
  MFIter::~MFIter(in_RDI);
  return;
}

Assistant:

void
Copy (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& srcarr = src.const_arrays();
        auto const& dstarr = dst.arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstarr[box_no](i,j,k,dstcomp+n) = srcarr[box_no](i,j,k,srccomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,dstcomp+n) = srcFab(i,j,k,srccomp+n);
                });
            }
        }
    }
}